

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_1::ComputePipeline::Resources::Resources
          (Resources *this,Environment *env,Parameters *param_2)

{
  Parameters *params;
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  bindings;
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  local_a8;
  Parameters local_80;
  undefined1 local_68 [48];
  value_type local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"comp",(allocator<char> *)&local_80);
  local_68._0_4_ = VK_SHADER_STAGE_COMPUTE_BIT;
  std::__cxx11::string::string((string *)(local_68 + 8),(string *)&local_a8);
  Dependency<vkt::api::(anonymous_namespace)::ShaderModule>::Dependency
            (&this->shaderModule,env,(Parameters *)local_68);
  std::__cxx11::string::~string((string *)(local_68 + 8));
  std::__cxx11::string::~string((string *)&local_a8);
  local_a8.
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.binding = 0;
  local_38.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  local_38.descriptorCount = 1;
  local_38.stageFlags = 0x20;
  local_38.useImmutableSampler = false;
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::push_back(&local_a8,&local_38);
  local_38.binding = 1;
  local_38.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  local_38.descriptorCount = 1;
  local_38.stageFlags = 0x20;
  local_38.useImmutableSampler = false;
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::push_back(&local_a8,&local_38);
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::vector(&local_80.bindings,&local_a8);
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::~vector(&local_a8);
  PipelineLayout::Parameters::singleDescriptorSet((Parameters *)local_68,&local_80);
  Dependency<vkt::api::(anonymous_namespace)::PipelineLayout>::Dependency
            (&this->layout,env,(Parameters *)local_68);
  PipelineLayout::Parameters::~Parameters((Parameters *)local_68);
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::~vector(&local_80.bindings);
  Dependency<vkt::api::(anonymous_namespace)::PipelineCache>::Dependency
            (&this->pipelineCache,env,params);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters&)
			: shaderModule		(env, ShaderModule::Parameters(VK_SHADER_STAGE_COMPUTE_BIT, "comp"))
			, layout			(env, PipelineLayout::Parameters::singleDescriptorSet(getDescriptorSetLayout()))
			, pipelineCache		(env, PipelineCache::Parameters())
		{}